

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void serialize_frames(ws_frame *frames,size_t num_frames)

{
  _Bool _Var1;
  cio_websocket_frame_type cVar2;
  frame_direction fVar3;
  void *__src;
  ulong __n;
  undefined8 in_RAX;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  uint16_t len;
  _Bool *p_Var9;
  bool bVar10;
  undefined4 uStack_38;
  uint8_t mask [4];
  
  p_Var9 = &frames->rsv;
  uVar7 = 0;
  _uStack_38 = in_RAX;
  do {
    iVar4 = 2;
    bVar10 = num_frames == 0;
    num_frames = num_frames - 1;
    iVar6 = (int)uVar7;
    if (bVar10) {
      frame_buffer_fill_pos = (ulong)(iVar6 - 1);
      return;
    }
    cVar2 = ((ws_frame *)(p_Var9 + -0x19))->frame_type;
    fVar3 = *(frame_direction *)(p_Var9 + -0x15);
    __src = *(void **)(p_Var9 + -0x11);
    __n = *(ulong *)(p_Var9 + -9);
    bVar8 = p_Var9[-1] << 7;
    _Var1 = *p_Var9;
    frame_buffer[uVar7] = bVar8;
    if ((_Var1 & 1U) != 0) {
      bVar8 = bVar8 | 0x70;
      frame_buffer[uVar7] = bVar8;
    }
    frame_buffer[uVar7] = (byte)cVar2 | bVar8;
    uVar5 = iVar6 + 1;
    bVar8 = (fVar3 == FROM_CLIENT) << 7;
    if (__n < 0x7e) {
      frame_buffer[uVar5] = bVar8 | (byte)__n;
    }
    else if (__n < 0x10000) {
      frame_buffer[uVar5] = bVar8 | 0x7e;
      *(short *)(frame_buffer + (iVar6 + 2)) = (short)__n;
      iVar4 = 4;
    }
    else {
      frame_buffer[uVar5] = bVar8 | 0x7f;
      *(ulong *)(frame_buffer + (iVar6 + 2)) = __n;
      iVar4 = 10;
    }
    uVar5 = iVar6 + iVar4;
    uVar7 = (ulong)uVar5;
    _uStack_38 = CONCAT44(0x4030201,uStack_38);
    if (fVar3 == FROM_CLIENT) {
      builtin_memcpy(frame_buffer + uVar5,"\x01\x02\x03\x04",4);
      uVar5 = uVar5 + 4;
      uVar7 = (ulong)uVar5;
      if (__n != 0) {
        memcpy(frame_buffer + uVar5,__src,__n);
        cio_websocket_mask(frame_buffer + uVar5,__n,mask);
        goto LAB_0010b13f;
      }
    }
    else if (__n != 0) {
      memcpy(frame_buffer + uVar5,__src,__n);
LAB_0010b13f:
      uVar7 = (ulong)((int)__n + uVar5);
    }
    p_Var9 = p_Var9 + 0x20;
  } while( true );
}

Assistant:

static void serialize_frames(struct ws_frame frames[], size_t num_frames)
{
	uint32_t buffer_pos = 0;
	for (size_t i = 0; i < num_frames; i++) {
		struct ws_frame frame = frames[i];
		if (frame.last_frame) {
			frame_buffer[buffer_pos] = WS_HEADER_FIN;
		} else {
			frame_buffer[buffer_pos] = 0x0;
		}

		if (frame.rsv) {
			frame_buffer[buffer_pos] |= 0x70;
		}

		frame_buffer[buffer_pos] = (uint8_t)(frame_buffer[buffer_pos] | frame.frame_type);
		buffer_pos++;

		if (frame.direction == FROM_CLIENT) {
			frame_buffer[buffer_pos] = WS_MASK_SET;
		} else {
			frame_buffer[buffer_pos] = 0x00;
		}

		if (frame.data_length <= 125) {
			frame_buffer[buffer_pos] = (uint8_t)((unsigned int)frame_buffer[buffer_pos] | (unsigned int)frame.data_length);
			buffer_pos++;
		} else if (frame.data_length < 65536) {
			uint16_t len = (uint16_t)frame.data_length;
			frame_buffer[buffer_pos] |= 126;
			buffer_pos++;
			len = cio_htobe16(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		} else {
			frame_buffer[buffer_pos] |= 127;
			buffer_pos++;
			uint64_t len = (uint64_t)frame.data_length;
			len = cio_htobe64(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		}

		uint8_t mask[4] = {0x1, 0x2, 0x3, 0x4};
		if (frame.direction == FROM_CLIENT) {
			memcpy(&frame_buffer[buffer_pos], mask, sizeof(mask));
			buffer_pos += (uint32_t)sizeof(mask);
		}

		if (frame.data_length > 0) {
			memcpy(&frame_buffer[buffer_pos], frame.data, frame.data_length);
			if (frame.direction == FROM_CLIENT) {
				cio_websocket_mask(&frame_buffer[buffer_pos], frame.data_length, mask);
			}

			buffer_pos += (uint32_t)frame.data_length;
		}
	}

	frame_buffer_fill_pos = buffer_pos - 1;
}